

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O1

LongReadsDatastore * __thiscall
WorkSpace::add_long_reads_datastore(WorkSpace *this,string *filename,string *name)

{
  pointer pcVar1;
  int iVar2;
  runtime_error *prVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_50 = filename;
  if (100 < (ulong)(((long)(this->long_reads_datastores).
                           super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->long_reads_datastores).
                           super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d)) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,
               "Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items"
              );
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  list_long_reads_datastores_abi_cxx11_(&local_48,this);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar4->_M_dataplus)._M_p;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + pbVar4->_M_string_length);
      if (local_68 == name->_M_string_length) {
        if (local_68 == 0) {
LAB_001bb78f:
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Name is already in use");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar2 = bcmp(local_70,(name->_M_dataplus)._M_p,local_68);
        if (iVar2 == 0) goto LAB_001bb78f;
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::vector<LongReadsDatastore,std::allocator<LongReadsDatastore>>::
  emplace_back<WorkSpace&,std::__cxx11::string_const&>
            ((vector<LongReadsDatastore,std::allocator<LongReadsDatastore>> *)
             &this->long_reads_datastores,this,local_50);
  if (name->_M_string_length != 0) {
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->long_reads_datastores).
                super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].name);
  }
  return (this->long_reads_datastores).
         super__Vector_base<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
}

Assistant:

LongReadsDatastore &WorkSpace::add_long_reads_datastore(const std::string &filename, const std::string &name) {
    if (long_reads_datastores.size() > MAX_WORKSPACE_VECTOR_SIZE) {
        throw std::runtime_error("Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items");
    }
    for (auto n:list_long_reads_datastores()) if (n==name) throw std::runtime_error("Name is already in use");
    long_reads_datastores.emplace_back(*this, filename);
    if (!name.empty()) long_reads_datastores.back().name = name;
    return long_reads_datastores.back();
}